

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::Finalize<duckdb::KahanAvgState,double,duckdb::KahanAverageOperation>
               (Vector *states,AggregateInputData *aggr_input_data,Vector *result,idx_t count,
               idx_t offset)

{
  long lVar1;
  long lVar2;
  long *plVar3;
  long lVar4;
  idx_t iVar5;
  double dVar6;
  undefined1 auVar7 [16];
  double dVar10;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  AggregateFinalizeData finalize_data;
  AggregateFinalizeData local_48;
  
  local_48.result = result;
  local_48.input = aggr_input_data;
  if (*states == (Vector)0x2) {
    duckdb::Vector::SetVectorType((VectorType)result);
    local_48.result_idx = 0;
    lVar1 = *(long *)**(long **)(states + 0x20);
    if (lVar1 == 0) {
      AggregateFinalizeData::ReturnNull(&local_48);
    }
    else {
      auVar7._8_4_ = (int)((ulong)lVar1 >> 0x20);
      auVar7._0_8_ = lVar1;
      auVar7._12_4_ = 0x45300000;
      dVar6 = (double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0;
      dVar10 = auVar7._8_8_ - 1.9342813113834067e+25;
      auVar8._0_8_ = dVar6 + dVar10;
      auVar8._8_8_ = dVar6 + dVar10;
      auVar11 = divpd(*(undefined1 (*) [16])((long *)**(long **)(states + 0x20) + 1),auVar8);
      **(double **)(result + 0x20) = auVar11._8_8_ + auVar11._0_8_;
    }
  }
  else {
    duckdb::Vector::SetVectorType((VectorType)result);
    lVar1 = *(long *)(states + 0x20);
    lVar2 = *(long *)(result + 0x20);
    if (count != 0) {
      iVar5 = 0;
      do {
        local_48.result_idx = offset + iVar5;
        plVar3 = *(long **)(lVar1 + iVar5 * 8);
        lVar4 = *plVar3;
        if (lVar4 == 0) {
          AggregateFinalizeData::ReturnNull(&local_48);
        }
        else {
          auVar11._8_4_ = (int)((ulong)lVar4 >> 0x20);
          auVar11._0_8_ = lVar4;
          auVar11._12_4_ = 0x45300000;
          dVar6 = (double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0;
          dVar10 = auVar11._8_8_ - 1.9342813113834067e+25;
          auVar9._0_8_ = dVar6 + dVar10;
          auVar9._8_8_ = dVar6 + dVar10;
          auVar11 = divpd(*(undefined1 (*) [16])(plVar3 + 1),auVar9);
          *(double *)(lVar2 + offset * 8 + iVar5 * 8) = auVar11._8_8_ + auVar11._0_8_;
        }
        iVar5 = iVar5 + 1;
      } while (count != iVar5);
    }
  }
  return;
}

Assistant:

static void Finalize(Vector &states, AggregateInputData &aggr_input_data, Vector &result, idx_t count,
	                     idx_t offset) {
		if (states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);

			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			auto rdata = ConstantVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			OP::template Finalize<RESULT_TYPE, STATE_TYPE>(**sdata, *rdata, finalize_data);
		} else {
			D_ASSERT(states.GetVectorType() == VectorType::FLAT_VECTOR);
			result.SetVectorType(VectorType::FLAT_VECTOR);

			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			auto rdata = FlatVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			for (idx_t i = 0; i < count; i++) {
				finalize_data.result_idx = i + offset;
				OP::template Finalize<RESULT_TYPE, STATE_TYPE>(*sdata[i], rdata[finalize_data.result_idx],
				                                               finalize_data);
			}
		}
	}